

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.hpp
# Opt level: O3

unique_ptr<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>_> __thiscall
TasGrid::GridReaderVersion5<TasGrid::GridFourier>::read<TasGrid::IO::mode_binary_type>
          (GridReaderVersion5<TasGrid::GridFourier> *this,AccelerationContext *acc,istream *is)

{
  void *pvVar1;
  long lVar2;
  pointer piVar3;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __result;
  undefined8 *puVar4;
  int *piVar5;
  int iVar6;
  unsigned_long in_RCX;
  int *piVar7;
  int *piVar8;
  pointer piVar9;
  int iVar10;
  int iVar11;
  MultiIndexSet *mset;
  int v;
  undefined1 local_108 [8];
  pointer piStack_100;
  vector<double,_std::allocator<double>_> local_f8;
  vector<int,_std::allocator<int>_> local_e0;
  vector<int,_std::allocator<int>_> local_c8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_b0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_98;
  vector<double,_std::allocator<double>_> local_80;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_68;
  vector<double,_std::allocator<double>_> local_48;
  
  puVar4 = (undefined8 *)operator_new(0x288);
  puVar4[1] = acc;
  puVar4[2] = 0;
  puVar4[3] = 0;
  *(undefined4 *)(puVar4 + 4) = 0;
  puVar4[5] = 0;
  puVar4[6] = 0;
  puVar4[7] = 0;
  puVar4[8] = 0;
  *(undefined4 *)(puVar4 + 9) = 0;
  puVar4[10] = 0;
  puVar4[0xb] = 0;
  puVar4[0xc] = 0;
  puVar4[0xd] = 0;
  puVar4[0xe] = 0;
  puVar4[0xf] = 0;
  puVar4[0x10] = 0;
  puVar4[0x11] = 0;
  *puVar4 = &PTR__GridFourier_001f7990;
  *(undefined1 *)(puVar4 + 0x12) = 0;
  *(undefined8 *)((long)puVar4 + 0x94) = 0;
  memset((vector<int,_std::allocator<int>_> *)(puVar4 + 0x14),0,0xb4);
  puVar4[0x2b] = 0;
  puVar4[0x2c] = 0;
  puVar4[0x2d] = 0;
  puVar4[0x2e] = 0;
  *(undefined4 *)(puVar4 + 0x2f) = 0;
  puVar4[0x30] = 0;
  puVar4[0x31] = 0;
  puVar4[0x32] = 0;
  puVar4[0x33] = 0;
  puVar4[0x34] = 0;
  puVar4[0x35] = 0;
  *(undefined8 *)((long)puVar4 + 0x1ac) = 0;
  *(undefined8 *)((long)puVar4 + 0x1b4) = 0;
  puVar4[0x38] = 0;
  puVar4[0x39] = 0;
  puVar4[0x3a] = 0;
  puVar4[0x3b] = 0;
  *(undefined4 *)(puVar4 + 0x3c) = 0;
  memset((vector<int,_std::allocator<int>_> *)(puVar4 + 0x3d),0,0xa0);
  *(undefined8 **)this = puVar4;
  ::std::istream::read((char *)is,(long)local_108);
  *(undefined4 *)(puVar4 + 2) = local_108._0_4_;
  ::std::istream::read((char *)is,(long)local_108);
  *(undefined4 *)((long)puVar4 + 0x14) = local_108._0_4_;
  MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>((MultiIndexSet *)local_108,is);
  *(TypeOneDRule *)(puVar4 + 0x2a) = (TypeOneDRule)piStack_100;
  puVar4[0x29] = local_108;
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)(puVar4 + 0x2b),
             (vector<int,_std::allocator<int>_> *)&local_f8);
  if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>((MultiIndexSet *)local_108,is);
  *(TypeOneDRule *)(puVar4 + 0x2f) = (TypeOneDRule)piStack_100;
  puVar4[0x2e] = local_108;
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)(puVar4 + 0x30),
             (vector<int,_std::allocator<int>_> *)&local_f8);
  if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  IO::readVector<TasGrid::IO::mode_binary_type,int,int>
            ((vector<int,_std::allocator<int>_> *)local_108,(IO *)is,
             (istream *)(ulong)*(uint *)(puVar4 + 0x2f),(int)in_RCX);
  pvVar1 = (void *)puVar4[0x33];
  lVar2 = puVar4[0x35];
  puVar4[0x33] = local_108;
  puVar4[0x34] = piStack_100;
  puVar4[0x35] = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_108 = (undefined1  [8])0x0;
  piStack_100 = (pointer)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,lVar2 - (long)pvVar1);
    if (local_108 != (undefined1  [8])0x0) {
      operator_delete((void *)local_108,
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start - (long)local_108);
    }
  }
  ::std::istream::read((char *)is,(long)local_108);
  if (local_108[0] == true) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>((MultiIndexSet *)local_108,is);
    *(TypeOneDRule *)(puVar4 + 4) = (TypeOneDRule)piStack_100;
    puVar4[3] = local_108;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(puVar4 + 5),
               (vector<int,_std::allocator<int>_> *)&local_f8);
    if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  ::std::istream::read((char *)is,(long)local_108);
  if (local_108[0] == true) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>((MultiIndexSet *)local_108,is);
    *(TypeOneDRule *)(puVar4 + 9) = (TypeOneDRule)piStack_100;
    puVar4[8] = local_108;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(puVar4 + 10),
               (vector<int,_std::allocator<int>_> *)&local_f8);
    if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  IO::readVector<TasGrid::IO::mode_binary_type,int,int>
            ((vector<int,_std::allocator<int>_> *)local_108,(IO *)is,
             (istream *)(ulong)*(uint *)(puVar4 + 2),(int)in_RCX);
  pvVar1 = (void *)puVar4[0x43];
  lVar2 = puVar4[0x45];
  puVar4[0x43] = local_108;
  puVar4[0x44] = piStack_100;
  puVar4[0x45] = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_108 = (undefined1  [8])0x0;
  piStack_100 = (pointer)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,lVar2 - (long)pvVar1);
    if (local_108 != (undefined1  [8])0x0) {
      operator_delete((void *)local_108,
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start - (long)local_108);
    }
  }
  if (0 < *(int *)((long)puVar4 + 0x14)) {
    StorageSet::StorageSet<TasGrid::IO::mode_binary_type>((StorageSet *)local_108,is);
    puVar4[0xd] = local_108;
    puVar4[0xe] = piStack_100;
    ::std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)(puVar4 + 0xf),&local_f8);
    if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    ::std::istream::read((char *)is,(long)local_108);
    if (local_108[0] == true) {
      piVar9 = (pointer)(long)*(int *)((long)puVar4 + 0x14);
      piVar3 = (pointer)((long)*(int *)(puVar4 + 4) * 2);
      IO::readVector<TasGrid::IO::mode_binary_type,double,unsigned_long>
                (&local_48,(IO *)is,(istream *)((long)piVar3 * (long)piVar9),in_RCX);
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      puVar4[0x46] = piVar9;
      puVar4[0x47] = piVar3;
      local_108 = (undefined1  [8])piVar9;
      piStack_100 = piVar3;
      ::std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)(puVar4 + 0x48),&local_f8);
      if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  ::std::istream::read((char *)is,(long)local_108);
  if (local_108[0] == true) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>((MultiIndexSet *)local_108,is);
    *(TypeOneDRule *)(puVar4 + 0x37) = (TypeOneDRule)piStack_100;
    puVar4[0x36] = local_108;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(puVar4 + 0x38),
               (vector<int,_std::allocator<int>_> *)&local_f8);
    if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    piVar5 = (int *)puVar4[0x38];
    piVar7 = (int *)puVar4[0x39];
    if (piVar5 == piVar7) {
      iVar10 = 0;
    }
    else {
      piVar8 = piVar5 + 1;
      if (piVar8 != piVar7) {
        iVar10 = *piVar5;
        do {
          iVar6 = *piVar8;
          iVar11 = iVar10;
          if (iVar10 <= iVar6) {
            iVar11 = iVar6;
          }
          if (iVar10 < iVar6) {
            piVar5 = piVar8;
          }
          piVar8 = piVar8 + 1;
          iVar10 = iVar11;
        } while (piVar8 != piVar7);
      }
      iVar10 = *piVar5;
    }
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>((MultiIndexSet *)local_108,is);
    iVar6 = (int)piVar7;
    *(TypeOneDRule *)(puVar4 + 0x3c) = (TypeOneDRule)piStack_100;
    puVar4[0x3b] = local_108;
    ::std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(puVar4 + 0x3d),
               (vector<int,_std::allocator<int>_> *)&local_f8);
    if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    IO::readVector<TasGrid::IO::mode_binary_type,int,int>
              ((vector<int,_std::allocator<int>_> *)local_108,(IO *)is,
               (istream *)(ulong)*(uint *)(puVar4 + 0x3c),iVar6);
    pvVar1 = (void *)puVar4[0x40];
    lVar2 = puVar4[0x42];
    puVar4[0x40] = local_108;
    puVar4[0x41] = piStack_100;
    puVar4[0x42] = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_108 = (undefined1  [8])0x0;
    piStack_100 = (pointer)0x0;
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,lVar2 - (long)pvVar1);
      if (local_108 != (undefined1  [8])0x0) {
        operator_delete((void *)local_108,
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start - (long)local_108);
      }
    }
  }
  else {
    piVar5 = (int *)puVar4[0x43];
    piVar7 = (int *)puVar4[0x44];
    piVar8 = piVar5 + 1;
    if (piVar8 != piVar7 && piVar5 != piVar7) {
      iVar10 = *piVar5;
      do {
        iVar6 = *piVar8;
        iVar11 = iVar10;
        if (iVar10 <= iVar6) {
          iVar11 = iVar6;
        }
        if (iVar10 < iVar6) {
          piVar5 = piVar8;
        }
        piVar8 = piVar8 + 1;
        iVar10 = iVar11;
      } while (piVar8 != piVar7);
    }
    iVar10 = *piVar5;
  }
  OneDimensionalWrapper::OneDimensionalWrapper
            ((OneDimensionalWrapper *)local_108,iVar10,rule_fourier,0.0,0.0);
  *(TypeOneDRule *)(puVar4 + 0x13) = (TypeOneDRule)piStack_100;
  puVar4[0x12] = local_108;
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)(puVar4 + 0x14),
             (vector<int,_std::allocator<int>_> *)&local_f8);
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)(puVar4 + 0x17),&local_e0);
  ::std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)(puVar4 + 0x1a),&local_c8);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)(puVar4 + 0x1d),&local_b0);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)(puVar4 + 0x20),&local_98);
  ::std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)(puVar4 + 0x23),&local_80);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)(puVar4 + 0x26),&local_68);
  OneDimensionalWrapper::~OneDimensionalWrapper((OneDimensionalWrapper *)local_108);
  mset = (MultiIndexSet *)(puVar4 + 8);
  if (puVar4[5] != puVar4[6]) {
    mset = (MultiIndexSet *)(puVar4 + 3);
  }
  MultiIndexManipulations::getMaxIndexes((vector<int,_std::allocator<int>_> *)local_108,mset);
  pvVar1 = (void *)puVar4[0x4b];
  lVar2 = puVar4[0x4d];
  puVar4[0x4b] = local_108;
  puVar4[0x4c] = piStack_100;
  puVar4[0x4d] = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_108 = (undefined1  [8])0x0;
  piStack_100 = (pointer)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,lVar2 - (long)pvVar1);
    if (local_108 != (undefined1  [8])0x0) {
      operator_delete((void *)local_108,
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start - (long)local_108);
    }
  }
  return (__uniq_ptr_data<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>,_true,_true>
          )(__uniq_ptr_data<TasGrid::GridFourier,_std::default_delete<TasGrid::GridFourier>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr<GridFourier> read(AccelerationContext const *acc, std::istream &is){
        std::unique_ptr<GridFourier> grid = Utils::make_unique<GridFourier>(acc);

        grid->num_dimensions = IO::readNumber<iomode, int>(is);
        grid->num_outputs = IO::readNumber<iomode, int>(is);

        grid->tensors = MultiIndexSet(is, iomode());
        grid->active_tensors = MultiIndexSet(is, iomode());
        grid->active_w = IO::readVector<iomode, int>(is, grid->active_tensors.getNumIndexes());

        if (IO::readFlag<iomode>(is)) grid->points = MultiIndexSet(is, iomode());
        if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());

        grid->max_levels = IO::readVector<iomode, int>(is, grid->num_dimensions);

        if (grid->num_outputs > 0){
            grid->values = StorageSet(is, iomode());
            if (IO::readFlag<iomode>(is))
                grid->fourier_coefs = IO::readData2D<iomode, double>(is, grid->num_outputs, 2 * grid->points.getNumIndexes());
        }

        int oned_max_level;
        if (IO::readFlag<iomode>(is)){
            grid->updated_tensors = MultiIndexSet(is, iomode());
            oned_max_level = grid->updated_tensors.getMaxIndex();

            grid->updated_active_tensors = MultiIndexSet(is, iomode());

            grid->updated_active_w = IO::readVector<iomode, int>(is, grid->updated_active_tensors.getNumIndexes());
        }else{
            oned_max_level = *std::max_element(grid->max_levels.begin(), grid->max_levels.end());
        }

        grid->wrapper = OneDimensionalWrapper(oned_max_level, rule_fourier, 0.0, 0.0);

        grid->max_power = MultiIndexManipulations::getMaxIndexes(((grid->points.empty()) ? grid->needed : grid->points));

        return grid;
    }